

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int act_disp_hdrs(nt_opts *opts)

{
  uint uVar1;
  char **ppcVar2;
  nifti_1_header *str;
  field_s *fieldp;
  uint nfields;
  long lVar3;
  long lVar4;
  
  uVar1 = (opts->flist).len;
  nfields = 0x2b;
  if (0 < (int)uVar1) {
    nfields = uVar1;
  }
  if (2 < g_debug) {
    fprintf(_stderr,"-d displaying %d fields for %d nifti datasets...\n",(ulong)nfields);
  }
  if (0 < (opts->infiles).len) {
    lVar4 = 0;
    do {
      str = nt_read_header(opts,(opts->infiles).list[lVar4],(int *)0x0,0);
      if (str == (nifti_1_header *)0x0) {
        return 1;
      }
      if (0 < g_debug) {
        fprintf(_stdout,"\nheader file \'%s\', num_fields = %d\n",(opts->infiles).list[lVar4]);
      }
      if (1 < g_debug) {
        act_disp_hdrs_cold_1();
      }
      if ((opts->flist).len < 1) {
        disp_field("\nall fields:\n",g_hdr_fields,str,nfields,(uint)(0 < g_debug));
      }
      else if (0 < (opts->flist).len) {
        ppcVar2 = (opts->flist).list;
        lVar3 = 0;
        do {
          fieldp = get_hdr_field(ppcVar2[lVar3],(uint)(lVar4 == 0));
          if (fieldp != (field_s *)0x0) {
            disp_field((char *)0x0,fieldp,str,1,(uint)((int)lVar3 == 0 && 0 < g_debug));
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 < (opts->flist).len);
      }
      free(str);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (opts->infiles).len);
  }
  return 0;
}

Assistant:

int act_disp_hdrs( nt_opts * opts )
{
   nifti_1_header *  nhdr;
   field_s        *  fnhdr;
   char           ** sptr;
   int               nfields, filenum, fc;

   /* set the number of fields to display */
   nfields = opts->flist.len > 0 ? opts->flist.len : NT_HDR_NUM_FIELDS;

   if( g_debug > 2 )
      fprintf(stderr,"-d displaying %d fields for %d nifti datasets...\n",
              nfields, opts->infiles.len);

   for( filenum = 0; filenum < opts->infiles.len; filenum++ )
   {
      /* do not validate the header structure */
      nhdr = nt_read_header(opts, opts->infiles.list[filenum], NULL, 0);
      if( !nhdr ) return 1;  /* errors are printed from library */

      if( g_debug > 0 )
         fprintf(stdout,"\nheader file '%s', num_fields = %d\n",
                 opts->infiles.list[filenum], nfields);
      if( g_debug > 1 )
         fprintf(stderr,"-d header is: %s\n",
                 nifti_hdr_looks_good(nhdr) ? "valid" : "invalid");

      if( opts->flist.len <= 0 ) /* then display all fields */
         disp_field("\nall fields:\n", g_hdr_fields, nhdr, nfields, g_debug>0);
      else  /* print only the requested fields... */
      {
         /* must locate each field before printing it */
         sptr = opts->flist.list;
         for( fc = 0; fc < opts->flist.len; fc++ )
         {
            fnhdr = get_hdr_field(*sptr, filenum == 0);
            if( fnhdr ) disp_field(NULL, fnhdr, nhdr, 1, g_debug>0 && fc == 0);
            sptr++;
         }
      }

      free(nhdr);
   }

   return 0;
}